

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Liby::Buffer::deepCopy(Buffer *this,Buffer *that)

{
  ulong uVar1;
  char *__dest;
  char *__src;
  long lVar3;
  ulong uVar4;
  long lVar2;
  
  if (this != that) {
    lVar3 = that->leftIndex_;
    lVar2 = that->rightIndex_;
    if (lVar3 != lVar2) {
      if (this->buffer_ != (char *)0x0) {
        operator_delete__(this->buffer_);
        this->buffer_ = (char *)0x0;
        lVar3 = that->leftIndex_;
        lVar2 = that->rightIndex_;
      }
      uVar1 = lVar2 - lVar3;
      if (lVar3 <= lVar2) {
        this->capacity_ = uVar1;
        uVar4 = 0xffffffffffffffff;
        if (-1 < (long)uVar1) {
          uVar4 = uVar1;
        }
        __dest = (char *)operator_new__(uVar4);
        this->buffer_ = __dest;
        __src = data(that);
        lVar3 = that->rightIndex_;
        if (that->leftIndex_ <= lVar3) {
          memcpy(__dest,__src,lVar3 - that->leftIndex_);
          this->leftIndex_ = 0;
          if (that->leftIndex_ <= lVar3) {
            this->rightIndex_ = lVar3 - that->leftIndex_;
            return;
          }
        }
      }
      __assert_fail("rightIndex_ >= leftIndex_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                    ,0x5a,"off_t Liby::Buffer::size() const");
    }
    this->leftIndex_ = 0;
    this->rightIndex_ = 0;
  }
  return;
}

Assistant:

void Buffer::deepCopy(const Buffer &that) {
    if (this == &that)
        return;
    if(that.empty()) {
        retrieve();
        return;
    }
    resetBuffer();
    capacity_ = that.size() + defaultPrependSize;
    buffer_ = new char[capacity_];
    ::memcpy(buffer_ + defaultPrependSize, that.data(), that.size());
    leftIndex_ = defaultPrependSize;
    rightIndex_ = that.size() + defaultPrependSize;
}